

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_service_base.hpp
# Opt level: O2

void __thiscall
asio::detail::reactive_socket_service_base::
start_op<asio::detail::reactive_socket_recv_op<asio::mutable_buffers_1,std::function<void(std::error_code_const&,unsigned_long)>,asio::any_io_executor>>
          (reactive_socket_service_base *this,base_implementation_type *impl,int op_type,
          reactive_socket_recv_op<asio::mutable_buffers_1,_std::function<void_(const_std::error_code_&,_unsigned_long)>,_asio::any_io_executor>
          *op,bool is_continuation,bool allow_speculative,bool noop,bool needs_non_blocking,
          void *param_8,
          enable_if_t<is_same<typename_associated_immediate_executor<typename_reactive_socket_recv_op<mutable_buffers_1,_function<void_(const_error_code_&,_unsigned_long)>,_any_io_executor>::handler_type,_typename_reactive_socket_recv_op<mutable_buffers_1,_function<void_(const_error_code_&,_unsigned_long)>,_any_io_executor>::io_executor_type>::asio_associated_immediate_executor_is_unspecialised,_void>::value>
          *param_9)

{
  do_start_op(this,impl,op_type,(reactor_op *)op,is_continuation,allow_speculative,noop,
              needs_non_blocking,epoll_reactor::call_post_immediate_completion,this->reactor_);
  return;
}

Assistant:

void start_op(base_implementation_type& impl, int op_type,
      Op* op, bool is_continuation, bool allow_speculative,
      bool noop, bool needs_non_blocking, const void*,
      enable_if_t<
        is_same<
          typename associated_immediate_executor<
            typename Op::handler_type,
            typename Op::io_executor_type
          >::asio_associated_immediate_executor_is_unspecialised,
          void
        >::value
      >*)
  {
    return do_start_op(impl, op_type, op, is_continuation,
        allow_speculative, noop, needs_non_blocking,
        &reactor::call_post_immediate_completion, &reactor_);
  }